

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationWeights::getWeightRanges
          (CollationWeights *this,uint32_t lowerLimit,uint32_t upperLimit)

{
  uint weight_00;
  uint uVar1;
  int32_t iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  WeightRange *pWVar5;
  bool bVar6;
  int local_100;
  int32_t length_3;
  UBool merged;
  uint32_t upperStart;
  uint32_t lowerEnd;
  int32_t length_2;
  uint32_t trail_1;
  int32_t length_1;
  uint32_t trail;
  int32_t length;
  uint32_t weight;
  WeightRange upper [5];
  WeightRange middle;
  WeightRange lower [5];
  int32_t upperLength;
  int32_t lowerLength;
  uint32_t upperLimit_local;
  uint32_t lowerLimit_local;
  CollationWeights *this_local;
  
  lower[4].count = lengthOfWeight(lowerLimit);
  lower[4].length = lengthOfWeight(upperLimit);
  if (lowerLimit < upperLimit) {
    if ((lower[4].count < lower[4].length) &&
       (uVar3 = truncateWeight(upperLimit,lower[4].count), lowerLimit == uVar3)) {
      this_local._7_1_ = false;
    }
    else {
      memset(&middle.length,0,0x50);
      memset(&upper[4].length,0,0x10);
      memset(&length,0,0x50);
      trail = lowerLimit;
      for (length_1 = lower[4].count; this->middleLength < length_1; length_1 = length_1 + -1) {
        uVar3 = getWeightTrail(trail,length_1);
        if (uVar3 < this->maxBytes[length_1]) {
          uVar4 = incWeightTrail(trail,length_1);
          lower[(long)length_1 + -1].length = uVar4;
          uVar4 = setWeightTrail(trail,length_1,this->maxBytes[length_1]);
          lower[(long)length_1 + -1].count = uVar4;
          lower[length_1].start = length_1;
          lower[length_1].end = this->maxBytes[length_1] - uVar3;
        }
        trail = truncateWeight(trail,length_1 + -1);
      }
      if (trail < 0xff000000) {
        upper[4].length = incWeightTrail(trail,this->middleLength);
      }
      else {
        upper[4].length = -1;
      }
      trail = upperLimit;
      for (length_2 = lower[4].length; this->middleLength < length_2; length_2 = length_2 + -1) {
        uVar3 = getWeightTrail(trail,length_2);
        if (this->minBytes[length_2] < uVar3) {
          uVar4 = setWeightTrail(trail,length_2,this->minBytes[length_2]);
          (&length)[(long)length_2 * 4] = uVar4;
          uVar4 = decWeightTrail(trail,length_2);
          upper[(long)length_2 + -1].count = uVar4;
          upper[length_2].start = length_2;
          upper[length_2].end = uVar3 - this->minBytes[length_2];
        }
        trail = truncateWeight(trail,length_2 + -1);
      }
      upper[4].count = decWeightTrail(trail,this->middleLength);
      middle.start = this->middleLength;
      if ((uint)upper[4].count < (uint)upper[4].length) {
        upperStart = 4;
LAB_002a9656:
        if (this->middleLength < (int)upperStart) {
          if (((int)lower[(int)upperStart].end < 1) || ((int)upper[(int)upperStart].end < 1))
          goto LAB_002a98aa;
          weight_00 = lower[(long)(int)upperStart + -1].count;
          uVar1 = (&length)[(long)(int)upperStart * 4];
          bVar6 = false;
          if (uVar1 < weight_00) {
            lower[(long)(int)upperStart + -1].count = upper[(long)(int)upperStart + -1].count;
            uVar3 = getWeightTrail(lower[(long)(int)upperStart + -1].count,upperStart);
            uVar4 = getWeightTrail(lower[(long)(int)upperStart + -1].length,upperStart);
            lower[(int)upperStart].end = (uVar3 - uVar4) + 1;
            bVar6 = true;
          }
          else if (weight_00 != uVar1) {
            uVar3 = incWeight(this,weight_00,upperStart);
            bVar6 = uVar3 == uVar1;
            if (bVar6) {
              lower[(long)(int)upperStart + -1].count = upper[(long)(int)upperStart + -1].count;
              lower[(int)upperStart].end = upper[(int)upperStart].end + lower[(int)upperStart].end;
            }
          }
          if (!bVar6) goto LAB_002a98aa;
          upper[(int)upperStart].end = 0;
          while (upperStart = upperStart - 1, this->middleLength < (int)upperStart) {
            upper[(int)upperStart].end = 0;
            lower[(int)upperStart].end = 0;
          }
        }
        goto LAB_002a98c2;
      }
      middle.end = ((uint)(upper[4].count - upper[4].length) >>
                   (('\x04' - (char)this->middleLength) * '\b' & 0x1fU)) + 1;
LAB_002a98c2:
      this->rangeCount = 0;
      if (0 < (int)middle.end) {
        this->ranges[0].start = upper[4].length;
        this->ranges[0].end = upper[4].count;
        this->ranges[0].length = middle.start;
        this->ranges[0].count = middle.end;
        this->rangeCount = 1;
      }
      local_100 = this->middleLength;
      while (local_100 = local_100 + 1, local_100 < 5) {
        if (0 < (int)upper[local_100].end) {
          pWVar5 = this->ranges + this->rangeCount;
          iVar2 = (&length + (long)local_100 * 4)[1];
          pWVar5->start = (&length + (long)local_100 * 4)[0];
          pWVar5->end = iVar2;
          uVar3 = upper[local_100].end;
          pWVar5->length = upper[local_100].start;
          pWVar5->count = uVar3;
          this->rangeCount = this->rangeCount + 1;
        }
        if (0 < (int)lower[local_100].end) {
          pWVar5 = this->ranges + this->rangeCount;
          iVar2 = lower[(long)local_100 + -1].count;
          pWVar5->start = lower[(long)local_100 + -1].length;
          pWVar5->end = iVar2;
          uVar3 = lower[local_100].end;
          pWVar5->length = lower[local_100].start;
          pWVar5->count = uVar3;
          this->rangeCount = this->rangeCount + 1;
        }
      }
      this_local._7_1_ = 0 < this->rangeCount;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
LAB_002a98aa:
  upperStart = upperStart - 1;
  goto LAB_002a9656;
}

Assistant:

UBool
CollationWeights::getWeightRanges(uint32_t lowerLimit, uint32_t upperLimit) {
    U_ASSERT(lowerLimit != 0);
    U_ASSERT(upperLimit != 0);

    /* get the lengths of the limits */
    int32_t lowerLength=lengthOfWeight(lowerLimit);
    int32_t upperLength=lengthOfWeight(upperLimit);

#ifdef UCOL_DEBUG
    printf("length of lower limit 0x%08lx is %ld\n", lowerLimit, lowerLength);
    printf("length of upper limit 0x%08lx is %ld\n", upperLimit, upperLength);
#endif
    U_ASSERT(lowerLength>=middleLength);
    // Permit upperLength<middleLength: The upper limit for secondaries is 0x10000.

    if(lowerLimit>=upperLimit) {
#ifdef UCOL_DEBUG
        printf("error: no space between lower & upper limits\n");
#endif
        return FALSE;
    }

    /* check that neither is a prefix of the other */
    if(lowerLength<upperLength) {
        if(lowerLimit==truncateWeight(upperLimit, lowerLength)) {
#ifdef UCOL_DEBUG
            printf("error: lower limit 0x%08lx is a prefix of upper limit 0x%08lx\n", lowerLimit, upperLimit);
#endif
            return FALSE;
        }
    }
    /* if the upper limit is a prefix of the lower limit then the earlier test lowerLimit>=upperLimit has caught it */

    WeightRange lower[5], middle, upper[5]; /* [0] and [1] are not used - this simplifies indexing */
    uprv_memset(lower, 0, sizeof(lower));
    uprv_memset(&middle, 0, sizeof(middle));
    uprv_memset(upper, 0, sizeof(upper));

    /*
     * With the limit lengths of 1..4, there are up to 7 ranges for allocation:
     * range     minimum length
     * lower[4]  4
     * lower[3]  3
     * lower[2]  2
     * middle    1
     * upper[2]  2
     * upper[3]  3
     * upper[4]  4
     *
     * We are now going to calculate up to 7 ranges.
     * Some of them will typically overlap, so we will then have to merge and eliminate ranges.
     */
    uint32_t weight=lowerLimit;
    for(int32_t length=lowerLength; length>middleLength; --length) {
        uint32_t trail=getWeightTrail(weight, length);
        if(trail<maxBytes[length]) {
            lower[length].start=incWeightTrail(weight, length);
            lower[length].end=setWeightTrail(weight, length, maxBytes[length]);
            lower[length].length=length;
            lower[length].count=maxBytes[length]-trail;
        }
        weight=truncateWeight(weight, length-1);
    }
    if(weight<0xff000000) {
        middle.start=incWeightTrail(weight, middleLength);
    } else {
        // Prevent overflow for primary lead byte FF
        // which would yield a middle range starting at 0.
        middle.start=0xffffffff;  // no middle range
    }

    weight=upperLimit;
    for(int32_t length=upperLength; length>middleLength; --length) {
        uint32_t trail=getWeightTrail(weight, length);
        if(trail>minBytes[length]) {
            upper[length].start=setWeightTrail(weight, length, minBytes[length]);
            upper[length].end=decWeightTrail(weight, length);
            upper[length].length=length;
            upper[length].count=trail-minBytes[length];
        }
        weight=truncateWeight(weight, length-1);
    }
    middle.end=decWeightTrail(weight, middleLength);

    /* set the middle range */
    middle.length=middleLength;
    if(middle.end>=middle.start) {
        middle.count=(int32_t)((middle.end-middle.start)>>(8*(4-middleLength)))+1;
    } else {
        /* no middle range, eliminate overlaps */
        for(int32_t length=4; length>middleLength; --length) {
            if(lower[length].count>0 && upper[length].count>0) {
                // Note: The lowerEnd and upperStart weights are versions of
                // lowerLimit and upperLimit (which are lowerLimit<upperLimit),
                // truncated (still less-or-equal)
                // and then with their last bytes changed to the
                // maxByte (for lowerEnd) or minByte (for upperStart).
                const uint32_t lowerEnd=lower[length].end;
                const uint32_t upperStart=upper[length].start;
                UBool merged=FALSE;

                if(lowerEnd>upperStart) {
                    // These two lower and upper ranges collide.
                    // Since lowerLimit<upperLimit and lowerEnd and upperStart
                    // are versions with only their last bytes modified
                    // (and following ones removed/reset to 0),
                    // lowerEnd>upperStart is only possible
                    // if the leading bytes are equal
                    // and lastByte(lowerEnd)>lastByte(upperStart).
                    U_ASSERT(truncateWeight(lowerEnd, length-1)==
                            truncateWeight(upperStart, length-1));
                    // Intersect these two ranges.
                    lower[length].end=upper[length].end;
                    lower[length].count=
                            (int32_t)getWeightTrail(lower[length].end, length)-
                            (int32_t)getWeightTrail(lower[length].start, length)+1;
                    // count might be <=0 in which case there is no room,
                    // and the range-collecting code below will ignore this range.
                    merged=TRUE;
                } else if(lowerEnd==upperStart) {
                    // Not possible, unless minByte==maxByte which is not allowed.
                    U_ASSERT(minBytes[length]<maxBytes[length]);
                } else /* lowerEnd<upperStart */ {
                    if(incWeight(lowerEnd, length)==upperStart) {
                        // Merge adjacent ranges.
                        lower[length].end=upper[length].end;
                        lower[length].count+=upper[length].count;  // might be >countBytes
                        merged=TRUE;
                    }
                }
                if(merged) {
                    // Remove all shorter ranges.
                    // There was no room available for them between the ranges we just merged.
                    upper[length].count=0;
                    while(--length>middleLength) {
                        lower[length].count=upper[length].count=0;
                    }
                    break;
                }
            }
        }
    }

#ifdef UCOL_DEBUG
    /* print ranges */
    for(int32_t length=4; length>=2; --length) {
        if(lower[length].count>0) {
            printf("lower[%ld] .start=0x%08lx .end=0x%08lx .count=%ld\n", length, lower[length].start, lower[length].end, lower[length].count);
        }
    }
    if(middle.count>0) {
        printf("middle   .start=0x%08lx .end=0x%08lx .count=%ld\n", middle.start, middle.end, middle.count);
    }
    for(int32_t length=2; length<=4; ++length) {
        if(upper[length].count>0) {
            printf("upper[%ld] .start=0x%08lx .end=0x%08lx .count=%ld\n", length, upper[length].start, upper[length].end, upper[length].count);
        }
    }
#endif

    /* copy the ranges, shortest first, into the result array */
    rangeCount=0;
    if(middle.count>0) {
        uprv_memcpy(ranges, &middle, sizeof(WeightRange));
        rangeCount=1;
    }
    for(int32_t length=middleLength+1; length<=4; ++length) {
        /* copy upper first so that later the middle range is more likely the first one to use */
        if(upper[length].count>0) {
            uprv_memcpy(ranges+rangeCount, upper+length, sizeof(WeightRange));
            ++rangeCount;
        }
        if(lower[length].count>0) {
            uprv_memcpy(ranges+rangeCount, lower+length, sizeof(WeightRange));
            ++rangeCount;
        }
    }
    return rangeCount>0;
}